

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableLoadSettings(ImGuiTable *table)

{
  ImGuiID *pIVar1;
  char *pcVar2;
  ImGuiTableColumn *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiID *pIVar5;
  ImGuiID *pIVar6;
  byte bVar7;
  ImGuiContext *g;
  long lVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  byte *pbVar12;
  ulong uVar13;
  bool bVar14;
  uint uVar15;
  
  pIVar4 = GImGui;
  table->IsSettingsRequestLoad = false;
  if ((table->Flags & 0x10) == 0) {
    lVar10 = (long)table->SettingsOffset;
    if (lVar10 == -1) {
      pIVar5 = (ImGuiID *)(pIVar4->SettingsTables).Buf.Data;
      pIVar1 = pIVar5 + 1;
      if (pIVar5 != (ImGuiID *)0x0) {
        pIVar6 = pIVar1;
        do {
          pIVar5 = pIVar6;
          if (*pIVar5 == table->ID) break;
          pIVar6 = (ImGuiID *)((long)(int)pIVar5[-1] + (long)pIVar5);
          pIVar5 = (ImGuiID *)0x0;
        } while (pIVar6 != (ImGuiID *)((long)(pIVar4->SettingsTables).Buf.Size + (long)pIVar1));
      }
      if (pIVar5 == (ImGuiID *)0x0) {
        return;
      }
      if (table->ColumnsCount != (int)(char)pIVar5[3]) {
        table->IsSettingsDirty = true;
      }
      table->SettingsOffset = (int)pIVar5 - *(int *)&(pIVar4->SettingsTables).Buf.Data;
    }
    else {
      pcVar2 = (pIVar4->SettingsTables).Buf.Data;
      pIVar5 = (ImGuiID *)(pcVar2 + lVar10);
      if ((int)pcVar2[lVar10 + 0xd] < table->ColumnsCount) {
        *pIVar5 = 0;
        pIVar5 = (ImGuiID *)0x0;
      }
    }
    table->SettingsLoadedFlags = pIVar5[1];
    table->RefScale = (float)pIVar5[2];
    bVar7 = (byte)pIVar5[3];
    uVar9 = 0;
    if ((char)bVar7 < '\x01') {
      uVar11 = 0;
    }
    else {
      pbVar12 = (byte *)((long)pIVar5 + 0x1b);
      uVar11 = 0;
      do {
        uVar15 = (uint)(char)pbVar12[-3];
        uVar13 = (ulong)uVar15;
        if ((-1 < (int)uVar15) && ((int)uVar15 < table->ColumnsCount)) {
          pIVar3 = (table->Columns).Data;
          if ((pIVar5[1] & 1) != 0) {
            *(undefined4 *)((long)&pIVar3[(int)uVar15].WidthRequest + (ulong)(*pbVar12 & 8)) =
                 *(undefined4 *)(pbVar12 + -0xb);
            pIVar3[(int)uVar15].AutoFitQueue = '\0';
          }
          if ((pIVar5[1] & 2) != 0) {
            uVar13 = (ulong)pbVar12[-2];
          }
          pIVar3[(int)uVar15].DisplayOrder = (ImGuiTableColumnIdx)uVar13;
          uVar11 = uVar11 | 1L << (uVar13 & 0x3f);
          bVar14 = (bool)(*pbVar12 >> 2 & 1);
          pIVar3[(int)uVar15].IsUserEnabledNextFrame = bVar14;
          pIVar3[(int)uVar15].IsUserEnabled = bVar14;
          pIVar3[(int)uVar15].SortOrder = pbVar12[-1];
          pIVar3[(int)uVar15].field_0x65 = pIVar3[(int)uVar15].field_0x65 & 0xfc | *pbVar12 & 3;
        }
        uVar9 = uVar9 + 1;
        bVar7 = (byte)pIVar5[3];
        pbVar12 = pbVar12 + 0xc;
      } while ((int)uVar9 < (int)(char)bVar7);
      uVar9 = (uint)(bVar7 == 0x40);
    }
    uVar13 = ~(-1L << (bVar7 & 0x3f));
    if ((char)uVar9 != '\0') {
      uVar13 = 0xffffffffffffffff;
    }
    if ((uVar11 != uVar13) && (0 < table->ColumnsCount)) {
      lVar10 = 0x52;
      lVar8 = 0;
      do {
        *(char *)((long)&((table->Columns).Data)->Flags + lVar10) = (char)lVar8;
        lVar8 = lVar8 + 1;
        lVar10 = lVar10 + 0x68;
      } while (lVar8 < table->ColumnsCount);
    }
    if (0 < table->ColumnsCount) {
      lVar10 = 0x52;
      lVar8 = 0;
      do {
        (table->DisplayOrderToIndex).Data[*(char *)((long)&((table->Columns).Data)->Flags + lVar10)]
             = (char)lVar8;
        lVar8 = lVar8 + 1;
        lVar10 = lVar10 + 0x68;
      } while (lVar8 < table->ColumnsCount);
    }
  }
  return;
}

Assistant:

void ImGui::TableLoadSettings(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    table->IsSettingsRequestLoad = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind settings
    ImGuiTableSettings* settings;
    if (table->SettingsOffset == -1)
    {
        settings = TableSettingsFindByID(table->ID);
        if (settings == NULL)
            return;
        if (settings->ColumnsCount != table->ColumnsCount) // Allow settings if columns count changed. We could otherwise decide to return...
            table->IsSettingsDirty = true;
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    else
    {
        settings = TableGetBoundSettings(table);
    }

    table->SettingsLoadedFlags = settings->SaveFlags;
    table->RefScale = settings->RefScale;

    // Serialize ImGuiTableSettings/ImGuiTableColumnSettings into ImGuiTable/ImGuiTableColumn
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();
    ImU64 display_order_mask = 0;
    for (int data_n = 0; data_n < settings->ColumnsCount; data_n++, column_settings++)
    {
        int column_n = column_settings->Index;
        if (column_n < 0 || column_n >= table->ColumnsCount)
            continue;

        ImGuiTableColumn* column = &table->Columns[column_n];
        if (settings->SaveFlags & ImGuiTableFlags_Resizable)
        {
            if (column_settings->IsStretch)
                column->StretchWeight = column_settings->WidthOrWeight;
            else
                column->WidthRequest = column_settings->WidthOrWeight;
            column->AutoFitQueue = 0x00;
        }
        if (settings->SaveFlags & ImGuiTableFlags_Reorderable)
            column->DisplayOrder = column_settings->DisplayOrder;
        else
            column->DisplayOrder = (ImGuiTableColumnIdx)column_n;
        display_order_mask |= (ImU64)1 << column->DisplayOrder;
        column->IsUserEnabled = column->IsUserEnabledNextFrame = column_settings->IsEnabled;
        column->SortOrder = column_settings->SortOrder;
        column->SortDirection = column_settings->SortDirection;
    }

    // Validate and fix invalid display order data
    const ImU64 expected_display_order_mask = (settings->ColumnsCount == 64) ? ~0 : ((ImU64)1 << settings->ColumnsCount) - 1;
    if (display_order_mask != expected_display_order_mask)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
            table->Columns[column_n].DisplayOrder = (ImGuiTableColumnIdx)column_n;

    // Rebuild index
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
}